

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

sftp_request * fxp_realpath_send(char *path)

{
  sftp_request *psVar1;
  sftp_packet *pkt;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(0x10);
  BinarySink_put_uint32(pkt->binarysink_,(ulong)psVar1->id);
  BinarySink_put_stringz(pkt->binarysink_,path);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_realpath_send(const char *path)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_REALPATH);
    put_uint32(pktout, req->id);
    put_stringz(pktout, path);
    sftp_send(pktout);

    return req;
}